

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O2

void __thiscall
cookmem::MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
setUsed(MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void> *this,
       MemChunk *chunk,size_type userSize)

{
  byte bVar1;
  ulong uVar2;
  byte bVar3;
  
  MemChunk::setUsedSize(chunk,this->m_storingExactSize,userSize);
  if (this->m_padding == true) {
    bVar1 = (((byte)(int)chunk->m_size & 0xf0) - (char)userSize) - 0x11;
    bVar3 = 8;
    if ((char)bVar1 < '\b') {
      bVar3 = bVar1;
    }
    uVar2 = 0;
    if ((char)bVar3 < '\x01') {
      bVar3 = 0;
    }
    for (; bVar3 != uVar2; uVar2 = uVar2 + 1) {
      *(char *)((long)&chunk[1].m_prevFootSize + uVar2 + userSize) = this->m_paddingByte;
    }
  }
  return;
}

Assistant:

inline void
    setUsed (MemChunk* chunk, size_type userSize)
    {
        chunk->setUsedSize (m_storingExactSize, userSize);

        // if we are padding, userSize will always be smaller
        // than the chunkSize
        if (m_padding)
        {
            size_type   chunkSize = chunk->getChunkSize ();
            char*       paddingPtr = ((char*)chunk) + userSize + CHUNK_OVERHEAD;
            char        diff = (char)(chunkSize - CHUNK_OVERHEAD - userSize - 1);
            if (diff > 8)
            {
                diff = 8;
            }
            for (int i = 0; i < diff; ++i)
            {
                paddingPtr[i] = m_paddingByte;
            }
        }
    }